

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  wasm_valtype_t *pwVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  wasm_extern_vec_t exports;
  int i;
  wasm_val_t results [1];
  wasm_extern_t *imports [2];
  wasm_byte_vec_t binary;
  wasm_val_t args [2];
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("callback.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(&binary,sVar3);
    sVar3 = fread(binary.data,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,&binary);
      if (lVar4 == 0) {
        pcVar12 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(&binary);
        puts("Creating callback...");
        pwVar5 = wasm_valtype_new_i32();
        results[0]._0_8_ = wasm_valtype_new_i32();
        exports.size = (size_t)pwVar5;
        wasm_valtype_vec_new(args,1,&exports);
        wasm_valtype_vec_new(imports,1,results);
        uVar6 = wasm_functype_new(args,imports);
        uVar7 = wasm_func_new(uVar2,uVar6,print_callback);
        i = 0x2a;
        exports.size = (size_t)wasm_valtype_new_i32();
        wasm_valtype_vec_new_empty(args);
        wasm_valtype_vec_new(imports,1,&exports);
        uVar8 = wasm_functype_new(args,imports);
        uVar9 = wasm_func_new_with_env(uVar2,uVar8,closure_callback,&i,0);
        wasm_functype_delete(uVar6);
        wasm_functype_delete(uVar8);
        puts("Instantiating module...");
        imports[0] = (wasm_extern_t *)wasm_func_as_extern(uVar7);
        imports[1] = (wasm_extern_t *)wasm_func_as_extern(uVar9);
        lVar10 = wasm_instance_new(uVar2,lVar4,imports,0);
        if (lVar10 == 0) {
          pcVar12 = "> Error instantiating module!";
        }
        else {
          wasm_func_delete(uVar7);
          wasm_func_delete(uVar9);
          puts("Extracting export...");
          wasm_instance_exports(lVar10,&exports);
          if (exports.size == 0) {
            pcVar12 = "> Error accessing exports!";
          }
          else {
            lVar11 = wasm_extern_as_func(*exports.data);
            if (lVar11 != 0) {
              wasm_module_delete(lVar4);
              wasm_instance_delete(lVar10);
              puts("Calling export...");
              args[0].kind = '\0';
              args[0].of.i32 = 3;
              args[1].kind = '\0';
              args[1].of.i32 = 4;
              lVar4 = wasm_func_call(lVar11,args,results);
              if (lVar4 == 0) {
                wasm_extern_vec_delete(&exports);
                puts("Printing result...");
                printf("> %u\n",(ulong)(uint)results[0].of._0_4_);
                puts("Shutting down...");
                wasm_store_delete(uVar2);
                wasm_engine_delete(uVar1);
                pcVar12 = "Done.";
              }
              else {
                pcVar12 = "> Error calling function!";
              }
              puts(pcVar12);
              return (uint)(lVar4 != 0);
            }
            pcVar12 = "> Error accessing export!";
          }
        }
      }
      goto LAB_001016e8;
    }
  }
  pcVar12 = "> Error loading module!";
LAB_001016e8:
  puts(pcVar12);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("callback.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  own wasm_functype_t* print_type = wasm_functype_new_1_1(wasm_valtype_new_i32(), wasm_valtype_new_i32());
  own wasm_func_t* print_func = wasm_func_new(store, print_type, print_callback);

  int i = 42;
  own wasm_functype_t* closure_type = wasm_functype_new_0_1(wasm_valtype_new_i32());
  own wasm_func_t* closure_func = wasm_func_new_with_env(store, closure_type, closure_callback, &i, NULL);

  wasm_functype_delete(print_type);
  wasm_functype_delete(closure_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {
    wasm_func_as_extern(print_func), wasm_func_as_extern(closure_func)
  };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(print_func);
  wasm_func_delete(closure_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t args[2];
  args[0].kind = WASM_I32;
  args[0].of.i32 = 3;
  args[1].kind = WASM_I32;
  args[1].of.i32 = 4;
  wasm_val_t results[1];
  if (wasm_func_call(run_func, args, results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %u\n", results[0].of.i32);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}